

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

void __thiscall tinyusdz::ascii::AsciiParser::AsciiParser(AsciiParser *this,StreamReader *sr)

{
  StreamReader *sr_local;
  AsciiParser *this_local;
  
  this->_sr = sr;
  ::std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&this->_path_stack);
  Cursor::Cursor(&this->_curr_cursor);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->_supported_prim_types);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->_supported_prim_attr_types);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->_supported_api_schemas);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
  ::map(&this->_supported_stage_metas);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
  ::map(&this->_supported_prim_metas);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
  ::map(&this->_supported_prop_metas);
  ::std::
  stack<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>>>
  ::
  stack<std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>>,void>
            ((stack<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>>>
              *)&this->err_stack);
  ::std::
  stack<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>>>
  ::
  stack<std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>>,void>
            ((stack<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>>>
              *)&this->warn_stack);
  ::std::
  stack<tinyusdz::ascii::AsciiParser::ParseState,std::deque<tinyusdz::ascii::AsciiParser::ParseState,std::allocator<tinyusdz::ascii::AsciiParser::ParseState>>>
  ::
  stack<std::deque<tinyusdz::ascii::AsciiParser::ParseState,std::allocator<tinyusdz::ascii::AsciiParser::ParseState>>,void>
            ((stack<tinyusdz::ascii::AsciiParser::ParseState,std::deque<tinyusdz::ascii::AsciiParser::ParseState,std::allocator<tinyusdz::ascii::AsciiParser::ParseState>>>
              *)&this->parse_stack);
  this->_version = 1.0;
  this->_toplevel = true;
  this->_sub_layered = false;
  this->_referenced = false;
  this->_payloaded = false;
  AsciiParserOption::AsciiParserOption(&this->_option);
  ::std::__cxx11::string::string((string *)&this->_base_dir);
  StageMetas::StageMetas(&this->_stage_metas);
  ::std::function<long_(long)>::function(&this->_prim_idx_assign_fun);
  ::std::function<bool_(const_tinyusdz::ascii::AsciiParser::StageMetas_&)>::function
            (&this->_stage_meta_process_fun);
  ::std::map<$40cfd1d7$>::map(&this->_prim_construct_fun_map);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_tinyusdz::Path_&,_long,_long)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_tinyusdz::Path_&,_long,_long)>_>_>_>
  ::map(&this->_post_prim_construct_fun_map);
  this->_primspec_mode = false;
  ::std::function<$3792144$>::function(&this->_primspec_fun,(nullptr_t)0x0);
  Setup(this);
  return;
}

Assistant:

AsciiParser::AsciiParser(StreamReader *sr) : _sr(sr) { Setup(); }